

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

int onig_is_in_code_range(OnigUChar *p,OnigCodePoint code)

{
  uint uVar1;
  bool bVar2;
  uint local_28;
  OnigCodePoint x;
  OnigCodePoint high;
  OnigCodePoint low;
  OnigCodePoint *data;
  OnigCodePoint n;
  OnigCodePoint code_local;
  OnigUChar *p_local;
  
  x = 0;
  uVar1 = *(uint *)p;
  while (local_28 = uVar1, x < local_28) {
    uVar1 = x + local_28 >> 1;
    if (*(uint *)(p + (ulong)(uVar1 * 2 + 1) * 4 + 4) < code) {
      x = uVar1 + 1;
      uVar1 = local_28;
    }
  }
  bVar2 = false;
  if (x < *(uint *)p) {
    bVar2 = *(uint *)(p + (ulong)(x << 1) * 4 + 4) <= code;
  }
  return (uint)bVar2;
}

Assistant:

extern int
onig_is_in_code_range(const UChar* p, OnigCodePoint code)
{
  OnigCodePoint n, *data;
  OnigCodePoint low, high, x;

  GET_CODE_POINT(n, p);
  data = (OnigCodePoint* )p;
  data++;

  for (low = 0, high = n; low < high; ) {
    x = (low + high) >> 1;
    if (code > data[x * 2 + 1])
      low = x + 1;
    else
      high = x;
  }

  return ((low < n && code >= data[low * 2]) ? 1 : 0);
}